

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ushort *puVar1;
  ServiceDescriptor *pSVar2;
  MethodDescriptor *method;
  long lVar3;
  long lVar4;
  MethodDescriptor *method_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string local_50;
  
  puVar1 = (ushort *)(((this->super_ServiceGenerator).descriptor_)->all_names_).payload_;
  local_50._M_dataplus._M_p = (pointer)(ulong)*puVar1;
  local_50._M_string_length = (long)puVar1 + ~(ulong)local_50._M_dataplus._M_p;
  text._M_str = 
  "public static com.google.protobuf.Service newReflectiveService(\n    final Interface impl) {\n  return new $classname$() {\n"
  ;
  text._M_len = 0x79;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  if (0 < pSVar2->method_count_) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      method_00 = (MethodDescriptor *)(&pSVar2->methods_->super_SymbolBase + lVar4);
      text_00._M_str = "@java.lang.Override\n";
      text_00._M_len = 0x14;
      io::Printer::Print<>(printer,text_00);
      GenerateMethodSignature(this,printer,method_00,IS_CONCRETE);
      UnderscoresToCamelCase_abi_cxx11_(&local_50,(java *)method_00,method);
      text_01._M_str = " {\n  impl.$method$(controller, request, done);\n}\n\n";
      text_01._M_len = 0x32;
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,text_01,(char (*) [7])0x13368bb,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 1;
      pSVar2 = (this->super_ServiceGenerator).descriptor_;
      lVar4 = lVar4 + 0x50;
    } while (lVar3 < pSVar2->method_count_);
  }
  io::Printer::Outdent(printer);
  text_02._M_str = "};\n";
  text_02._M_len = 3;
  io::Printer::Print<>(printer,text_02);
  io::Printer::Outdent(printer);
  text_03._M_str = "}\n\n";
  text_03._M_len = 3;
  io::Printer::Print<>(printer,text_03);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Service newReflectiveService(\n"
      "    final Interface impl) {\n"
      "  return new $classname$() {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("@java.lang.Override\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(
        " {\n"
        "  impl.$method$(controller, request, done);\n"
        "}\n\n",
        "method", UnderscoresToCamelCase(method));
  }

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}